

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

int __thiscall
TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
::SolveDirect(TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
              *this,TPZFMatrix<std::complex<float>_> *B,DecomposeType dt,
             list<long,_std::allocator<long>_> *singular)

{
  DecomposeType DVar1;
  
  DVar1 = TPZFrontSym<std::complex<float>_>::GetDecomposeType(&this->fFront);
  if (DVar1 != dt) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/TPZFrontMatrix.cpp"
               ,0x142);
  }
  (*(this->super_TPZAbstractFrontMatrix<std::complex<float>_>).super_TPZMatrix<std::complex<float>_>
    .super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x44])(this,B);
  (*(this->super_TPZAbstractFrontMatrix<std::complex<float>_>).super_TPZMatrix<std::complex<float>_>
    .super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x45])(this,B);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::SolveDirect( TPZFMatrix<TVar> &B , DecomposeType dt, std::list<int64_t> &singular) {
    if (fFront.GetDecomposeType() != dt) {
        DebugStop();
    }
#ifdef PZ_LOG2
    if (logger.isDebugEnabled())
    {
        
        std::stringstream sout;
        B.Print("On input " , sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    Subst_Forward(&B);
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        B.Print("After forward and diagonal " , sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    Subst_Backward(&B);
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        B.Print("Final result " , sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    return 1;
}